

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O0

void __thiscall hwnet::ThreadPool::TaskQueue::Close(TaskQueue *this)

{
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> guard;
  TaskQueue *this_local;
  
  guard._M_device = (mutex_type *)this;
  std::lock_guard<std::mutex>::lock_guard(&local_18,&this->mtx);
  if ((this->closed & 1U) == 0) {
    this->closed = true;
    std::_V2::condition_variable_any::notify_all(&this->cv);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_18);
  return;
}

Assistant:

void ThreadPool::TaskQueue::Close() {
	std::lock_guard<std::mutex> guard(this->mtx);
	if(!this->closed) {
		this->closed = true;
		this->cv.notify_all();
	}
}